

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_bytes_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sexp obj;
  sexp in_RCX;
  sexp in_RDX;
  char *in_R8;
  sexp s;
  sexp_sint_t clen;
  sexp local_8;
  
  auVar1._8_8_ = (long)in_RCX >> 0x3f;
  auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
  obj = SUB168(auVar1 / SEXT816(2),0);
  if (((ulong)in_RCX & 1) == 1) {
    if ((long)obj < 0) {
      local_8 = sexp_xtype_exception(in_RDX,in_RCX,in_R8,obj);
    }
    else {
      local_8 = (sexp)sexp_alloc(in_RDX,(size_t)in_RCX);
      if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
        local_8->tag = 8;
        (local_8->value).type.name = obj;
        if (((ulong)in_R8 & 1) == 1) {
          auVar2._8_8_ = (long)in_R8 >> 0x3f;
          auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
          memset((void *)((long)&local_8->value + 8),(uint)SUB161(auVar2 / SEXT816(2),0),(size_t)obj
                );
        }
        ((local_8->value).flonum_bits + 8)[(long)obj] = '\0';
      }
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,obj);
  }
  return local_8;
}

Assistant:

sexp sexp_make_bytes_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp i) {
  sexp_sint_t clen = sexp_unbox_fixnum(len);
  sexp s;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
  if (clen < 0) return sexp_xtype_exception(ctx, self, "negative length", len);
  s = sexp_alloc_atomic(ctx, sexp_sizeof(bytes)+clen+1);
  if (sexp_exceptionp(s)) return s;
  sexp_pointer_tag(s) = SEXP_BYTES;
#if SEXP_USE_HEADER_MAGIC
  sexp_pointer_magic(s) = SEXP_POINTER_MAGIC;
#endif
  sexp_bytes_length(s) = clen;
  if (sexp_fixnump(i))
    memset(sexp_bytes_data(s), sexp_unbox_fixnum(i), clen);
  sexp_bytes_data(s)[clen] = '\0';
  return s;
}